

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

char * add_to_buffer(char *str,int fd,int *pos,char *buffer,int buffer_size,int *num_printed,
                    int print_percent)

{
  char cVar1;
  int iVar2;
  undefined4 in_register_00000084;
  
  while( true ) {
    cVar1 = *str;
    if ((cVar1 == '\0') || ((int)num_printed == 0 && cVar1 == '%')) break;
    if ((long)*pos < 0x1000) {
      buffer[*pos] = cVar1;
      iVar2 = *pos + 1;
    }
    else {
      gotcha_write(fd,buffer,0x1000);
      *(int *)CONCAT44(in_register_00000084,buffer_size) =
           *(int *)CONCAT44(in_register_00000084,buffer_size) + 0x1000;
      iVar2 = 1;
    }
    *pos = iVar2;
    str = str + 1;
  }
  return str;
}

Assistant:

static const char *add_to_buffer(const char *str, int fd, int *pos,
                                 char *buffer, int buffer_size,
                                 int *num_printed, int print_percent) {
  for (; *str && (print_percent || *str != '%'); str++) {
    if (*pos >= buffer_size) {  // GCOVR_EXCL_START
      gotcha_write(fd, buffer, buffer_size);
      *num_printed += buffer_size;
      *pos = 0;
    }  // GCOVR_EXCL_STOP
    else {
      buffer[*pos] = *str;
    }
    *pos = *pos + 1;
  }
  return str;
}